

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlOutputJson.c
# Opt level: O2

JL_STATUS JlOutputJson(JlDataObject *DataObject,_Bool IndentedFormat,char **pJsonStringBuffer)

{
  JL_STATUS JVar1;
  undefined7 in_register_00000031;
  
  JVar1 = JlOutputJsonEx(DataObject,
                         (ulong)(uint)((int)CONCAT71(in_register_00000031,IndentedFormat) * 2),
                         pJsonStringBuffer);
  return JVar1;
}

Assistant:

JL_STATUS
    JlOutputJson
    (
        JlDataObject const*     DataObject,
        bool                    IndentedFormat,
        char**                  pJsonStringBuffer
    )
{
    JL_STATUS jlStatus;

    jlStatus = JlOutputJsonEx(
        DataObject,
        IndentedFormat ? JL_OUTPUT_FLAGS_INDENT : JL_OUTPUT_FLAGS_NONE,
        pJsonStringBuffer );

    return jlStatus;
}